

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

void cmcmdProgressReport(string *dir,string *num)

{
  int iVar1;
  unsigned_long uVar2;
  char *pcStack_88;
  int fileNum;
  char *c;
  char *last;
  FILE *pFStack_70;
  int count;
  FILE *progFile;
  string fName;
  undefined1 local_38 [8];
  string dirName;
  string *num_local;
  string *dir_local;
  
  dirName.field_2._8_8_ = num;
  std::__cxx11::string::string((string *)local_38,(string *)dir);
  std::__cxx11::string::operator+=((string *)local_38,"/Progress");
  std::__cxx11::string::string((string *)&progFile);
  std::__cxx11::string::operator=((string *)&progFile,(string *)local_38);
  std::__cxx11::string::operator+=((string *)&progFile,"/count.txt");
  pFStack_70 = (FILE *)cmsys::SystemTools::Fopen((string *)&progFile,"r");
  last._4_4_ = 0;
  if (pFStack_70 != (FILE *)0x0) {
    iVar1 = __isoc99_fscanf(pFStack_70,"%i",(long)&last + 4);
    if (iVar1 != 1) {
      cmSystemTools::Message("Could not read from progress file.",(char *)0x0);
    }
    fclose(pFStack_70);
    pcStack_88 = (char *)std::__cxx11::string::c_str();
    c = pcStack_88;
    do {
      if ((*pcStack_88 == ',') || (*pcStack_88 == '\0')) {
        if (pcStack_88 != c) {
          std::__cxx11::string::operator=((string *)&progFile,(string *)local_38);
          std::__cxx11::string::operator+=((string *)&progFile,"/");
          std::__cxx11::string::append((char *)&progFile,(ulong)c);
          pFStack_70 = (FILE *)cmsys::SystemTools::Fopen((string *)&progFile,"w");
          if (pFStack_70 != (FILE *)0x0) {
            fprintf(pFStack_70,"empty");
            fclose(pFStack_70);
          }
        }
        if (*pcStack_88 == '\0') goto LAB_00422286;
        c = pcStack_88 + 1;
      }
      pcStack_88 = pcStack_88 + 1;
    } while( true );
  }
  last._0_4_ = 1;
LAB_004222dc:
  std::__cxx11::string::~string((string *)&progFile);
  std::__cxx11::string::~string((string *)local_38);
  return;
LAB_00422286:
  uVar2 = cmsys::Directory::GetNumberOfFilesInDirectory((string *)local_38);
  if (0 < last._4_4_) {
    fprintf(_stdout,"[%3i%%] ",(long)(((int)uVar2 + -3) * 100) / (long)last._4_4_ & 0xffffffff);
  }
  last._0_4_ = 0;
  goto LAB_004222dc;
}

Assistant:

static void cmcmdProgressReport(std::string const& dir,
                                std::string const& num)
{
  std::string dirName = dir;
  dirName += "/Progress";
  std::string fName;
  FILE *progFile;

  // read the count
  fName = dirName;
  fName += "/count.txt";
  progFile = cmsys::SystemTools::Fopen(fName,"r");
  int count = 0;
  if (!progFile)
    {
    return;
    }
  else
    {
    if (1!=fscanf(progFile,"%i",&count))
      {
      cmSystemTools::Message("Could not read from progress file.");
      }
    fclose(progFile);
    }
  const char* last = num.c_str();
  for(const char* c = last;; ++c)
    {
    if (*c == ',' || *c == '\0')
      {
      if (c != last)
        {
        fName = dirName;
        fName += "/";
        fName.append(last, c-last);
        progFile = cmsys::SystemTools::Fopen(fName,"w");
        if (progFile)
          {
          fprintf(progFile,"empty");
          fclose(progFile);
          }
        }
      if(*c == '\0')
        {
        break;
        }
      last = c + 1;
      }
    }
  int fileNum = static_cast<int>
    (cmsys::Directory::GetNumberOfFilesInDirectory(dirName));
  if (count > 0)
    {
    // print the progress
    fprintf(stdout,"[%3i%%] ",((fileNum-3)*100)/count);
    }
}